

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
Scope::define(Scope *this,string *variableName,shared_ptr<Token> *token,bool isFullyBound)

{
  bool bVar1;
  mapped_type *pmVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>
  local_88;
  undefined1 local_50 [8];
  VariableDefinition vd;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
  local_30;
  iterator find;
  bool isFullyBound_local;
  shared_ptr<Token> *token_local;
  string *variableName_local;
  Scope *this_local;
  
  find.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
  ._M_cur._7_1_ = isFullyBound;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>_>_>
       ::find(&this->localScope,variableName);
  vd._16_8_ = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>_>_>
              ::end(&this->localScope);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
                      *)&vd.isFullyBound);
  if (bVar1) {
    VariableDefinition::VariableDefinition((VariableDefinition *)local_50);
    vd.token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
         find.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
         ._M_cur._7_1_ & 1;
    std::shared_ptr<Token>::operator=((shared_ptr<Token> *)local_50,token);
    std::make_pair<std::__cxx11::string_const&,VariableDefinition&>
              (&local_88,variableName,(VariableDefinition *)local_50);
    std::
    unordered_map<std::__cxx11::string,VariableDefinition,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VariableDefinition>>>
    ::insert<std::pair<std::__cxx11::string,VariableDefinition>>
              ((unordered_map<std::__cxx11::string,VariableDefinition,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VariableDefinition>>>
                *)&this->localScope,&local_88);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>
    ::~pair(&local_88);
    VariableDefinition::~VariableDefinition((VariableDefinition *)local_50);
  }
  else {
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>_>_>
             ::at(&this->localScope,variableName);
    pmVar2->isFullyBound = true;
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>_>_>
             ::at(&this->localScope,variableName);
    std::shared_ptr<Token>::operator=(&pmVar2->token,token);
  }
  return;
}

Assistant:

void define(const std::string & variableName, std::shared_ptr<Token> token, bool isFullyBound) {
    auto find = this->localScope.find(variableName);

    if (find == this->localScope.end()) {
      VariableDefinition vd;
      vd.isFullyBound = isFullyBound;
      vd.token = token;
      this->localScope.insert(std::make_pair(variableName, vd));

    } else {
      this->localScope.at(variableName).isFullyBound = true;
      this->localScope.at(variableName).token = token;
    }
  }